

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintUInt64_abi_cxx11_
          (FieldValuePrinter *this,uint64 val)

{
  string *psVar1;
  StringBaseTextGenerator *in_RDI;
  BaseTextGenerator *unaff_retaddr;
  uint64 in_stack_00000008;
  FastFieldValuePrinter *in_stack_00000010;
  StringBaseTextGenerator generator;
  StringBaseTextGenerator *this_00;
  StringBaseTextGenerator local_40 [64];
  
  this_00 = in_RDI;
  anon_unknown_19::StringBaseTextGenerator::StringBaseTextGenerator(in_RDI);
  FastFieldValuePrinter::PrintUInt64(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  psVar1 = (anonymous_namespace)::StringBaseTextGenerator::Get_abi_cxx11_(local_40);
  std::__cxx11::string::string((string *)this_00,(string *)psVar1);
  anon_unknown_19::StringBaseTextGenerator::~StringBaseTextGenerator(this_00);
  return (string *)in_RDI;
}

Assistant:

std::string TextFormat::FieldValuePrinter::PrintUInt64(uint64 val) const {
  FORWARD_IMPL(PrintUInt64, val);
}